

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O0

MultisamplePixelBufferAccess * __thiscall
sglr::ReferenceContext::getReadDepthbuffer
          (MultisamplePixelBufferAccess *__return_storage_ptr__,ReferenceContext *this)

{
  PixelBufferAccess local_40;
  ReferenceContext *local_18;
  ReferenceContext *this_local;
  
  local_18 = this;
  this_local = (ReferenceContext *)__return_storage_ptr__;
  if (this->m_readFramebufferBinding == (Framebuffer *)0x0) {
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
              (__return_storage_ptr__,&this->m_defaultDepthbuffer);
  }
  else {
    getFboAttachment(&local_40,this,this->m_readFramebufferBinding,ATTACHMENTPOINT_DEPTH);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

rr::MultisamplePixelBufferAccess	getReadDepthbuffer		(void)	{ return (m_readFramebufferBinding) ? (rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(getFboAttachment(*m_readFramebufferBinding, rc::Framebuffer::ATTACHMENTPOINT_DEPTH)))	:	(m_defaultDepthbuffer);		}